

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::device_tree::resolve_cross_references(device_tree *this,uint32_t *phandle)

{
  property_value *ppVar1;
  FILE *pFVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  reference pppVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  ulong uVar9;
  element_type *peVar10;
  size_type sVar11;
  size_type sVar12;
  reference this_00;
  fixup *pfVar13;
  char *pcVar14;
  mapped_type *pmVar15;
  undefined8 uVar16;
  element_type *this_01;
  pointer this_02;
  pair<std::__detail::_Node_iterator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_false,_false>,_bool>
  pVar17;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_618;
  shared_ptr<dtc::fdt::node> local_610;
  undefined1 local_600 [8];
  property_ptr p_1;
  int local_5cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_568;
  shared_ptr<dtc::fdt::node> *c;
  child_iterator __end5;
  child_iterator __begin5;
  child_range *__range5;
  node_ptr next;
  string node_address;
  string node_name;
  istringstream nss;
  string local_370 [8];
  string path_element;
  istringstream ss;
  undefined1 local_1d0 [8];
  string path_1;
  string possible;
  node_ptr target;
  string target_name;
  reference_wrapper<dtc::fdt::device_tree::fixup> *i_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  *__range2_2;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  *local_138;
  function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> local_130;
  undefined1 local_110 [8];
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  sorted_phandles;
  property_value *local_e8;
  pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&> local_e0;
  reference local_d0;
  fixup *i;
  iterator __end2_1;
  iterator __begin2_1;
  vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_> *__range2_1;
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  phandle_set;
  value_type_conflict1 local_61;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  iterator pe;
  iterator p;
  node_path path;
  property_value *pv;
  iterator __end2;
  iterator __begin2;
  vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_> *__range2;
  uint32_t *phandle_local;
  device_tree *this_local;
  
  __end2 = std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>::
           begin(&this->cross_references);
  pv = (property_value *)
       std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>::end
                 (&this->cross_references);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<dtc::fdt::property_value_**,_std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>_>
                                     *)&pv), bVar3) {
    pppVar6 = __gnu_cxx::
              __normal_iterator<dtc::fdt::property_value_**,_std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>_>
              ::operator*(&__end2);
    ppVar1 = *pppVar6;
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
             ::operator[](&this->node_paths,&ppVar1->string_data);
    node_path::node_path((node_path *)&p,pmVar7);
    pe = std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&p);
    local_60._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&p);
    bVar3 = __gnu_cxx::operator!=(&pe,&local_60);
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&pe);
      while (bVar3 = __gnu_cxx::operator!=(&pe,&local_60), bVar3) {
        local_61 = '/';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&ppVar1->byte_data,&local_61);
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&pe);
        push_string(&ppVar1->byte_data,&ppVar8->first,false);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator->(&pe);
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          phandle_set._M_h._M_single_bucket._3_1_ = 0x40;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&ppVar1->byte_data,
                     (value_type_conflict1 *)((long)&phandle_set._M_h._M_single_bucket + 3));
          ppVar8 = __gnu_cxx::
                   __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator->(&pe);
          push_string(&ppVar1->byte_data,&ppVar8->second,false);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&pe);
      }
      phandle_set._M_h._M_single_bucket._2_1_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&ppVar1->byte_data,
                 (value_type_conflict1 *)((long)&phandle_set._M_h._M_single_bucket + 2));
    }
    node_path::~node_path((node_path *)&p);
    __gnu_cxx::
    __normal_iterator<dtc::fdt::property_value_**,_std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>_>
    ::operator++(&__end2);
  }
  std::
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  ::unordered_map((unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
                   *)&__range2_1);
  __end2_1 = std::
             vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>::
             begin(&this->fixups);
  i = (fixup *)std::
               vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>::
               end(&this->fixups);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<dtc::fdt::device_tree::fixup_*,_std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>_>
                             *)&i), bVar3) {
    local_d0 = __gnu_cxx::
               __normal_iterator<dtc::fdt::device_tree::fixup_*,_std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>_>
               ::operator*(&__end2_1);
    local_e8 = local_d0->val;
    std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>::
    pair<dtc::fdt::property_value_*,_true>(&local_e0,&local_e8,local_d0);
    pVar17 = std::
             unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
             ::insert((unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
                       *)&__range2_1,&local_e0);
    sorted_phandles.
    super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)pVar17.first.
                  super__Node_iterator_base<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_false>
                  ._M_cur;
    __gnu_cxx::
    __normal_iterator<dtc::fdt::device_tree::fixup_*,_std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ::vector((vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
            *)local_110);
  peVar10 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->root);
  __range2_2 = (vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                *)&__range2_1;
  local_138 = (vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
               *)local_110;
  std::function<dtc::fdt::node::visit_behavior(dtc::fdt::node&,dtc::fdt::node*)>::
  function<dtc::fdt::device_tree::resolve_cross_references(unsigned_int&)::__0,void>
            ((function<dtc::fdt::node::visit_behavior(dtc::fdt::node&,dtc::fdt::node*)> *)&local_130
             ,(anon_class_16_2_d6ea1cab *)&__range2_2);
  node::visit(peVar10,&local_130,(node *)0x0);
  std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::~function
            (&local_130);
  sVar11 = std::
           vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
           ::size((vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                   *)local_110);
  sVar12 = std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
           ::size(&this->fixups);
  if (sVar11 != sVar12) {
    __assert_fail("sorted_phandles.size() == fixups.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x58d,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
  }
  __end2_2 = std::
             vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
             ::begin((vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                      *)local_110);
  i_1 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)
        std::
        vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
        ::end((vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
               *)local_110);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_*,_std::vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>_>
                             *)&i_1), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_*,_std::vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>_>
              ::operator*(&__end2_2);
    pfVar13 = std::reference_wrapper<dtc::fdt::device_tree::fixup>::get(this_00);
    std::__cxx11::string::string
              ((string *)
               &target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)&pfVar13->val->string_data);
    std::shared_ptr<dtc::fdt::node>::shared_ptr
              ((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8));
    std::__cxx11::string::string((string *)(path_1.field_2._M_local_buf + 8));
    pcVar14 = (char *)std::__cxx11::string::operator[]
                                ((ulong)&target.
                                         super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
    if (*pcVar14 == '/') {
      std::__cxx11::string::string((string *)local_1d0);
      std::shared_ptr<dtc::fdt::node>::operator=
                ((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8),&this->root);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)((long)&path_element.field_2 + 8),
                 &target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 8);
      std::__cxx11::string::string(local_370);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(path_element.field_2._M_local_buf + 8),local_370,'/');
      do {
        bVar4 = std::ios::eof();
        if (((bVar4 ^ 0xff) & 1) == 0) break;
        std::__cxx11::string::operator+=((string *)local_1d0,'/');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(path_element.field_2._M_local_buf + 8),local_370,'/');
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)((long)&node_name.field_2 + 8),local_370,8);
        std::__cxx11::string::string((string *)(node_address.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)
                   &next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(node_name.field_2._M_local_buf + 8),
                   (string *)(node_address.field_2._M_local_buf + 8),'@');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(node_name.field_2._M_local_buf + 8),
                   (string *)
                   &next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   '@');
        std::shared_ptr<dtc::fdt::node>::shared_ptr((shared_ptr<dtc::fdt::node> *)&__range5);
        peVar10 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(possible.field_2._M_local_buf + 8));
        __begin5._M_current = (shared_ptr<dtc::fdt::node> *)node::child_nodes(peVar10);
        __end5 = node::child_range::begin((child_range *)&__begin5);
        c = (shared_ptr<dtc::fdt::node> *)node::child_range::end((child_range *)&__begin5);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
                                           *)&c), bVar3) {
          local_568 = (__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)__gnu_cxx::
                         __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
                         ::operator*(&__end5);
          peVar10 = std::
                    __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(local_568);
          _Var5 = std::operator==(&peVar10->name,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&node_address.field_2 + 8));
          if (_Var5) {
            peVar10 = std::
                      __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(local_568);
            _Var5 = std::operator==(&peVar10->unit_address,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&next.
                                        super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
            if (_Var5) {
              std::shared_ptr<dtc::fdt::node>::operator=
                        ((shared_ptr<dtc::fdt::node> *)&__range5,
                         (shared_ptr<dtc::fdt::node> *)local_568);
              break;
            }
            peVar10 = std::
                      __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(local_568);
            std::operator+(&local_588,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0,&peVar10->name);
            std::__cxx11::string::operator=
                      ((string *)(path_1.field_2._M_local_buf + 8),(string *)&local_588);
            std::__cxx11::string::~string((string *)&local_588);
            peVar10 = std::
                      __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(local_568);
            std::__cxx11::string::string((string *)&local_5a8);
            bVar3 = std::operator!=(&peVar10->unit_address,&local_5a8);
            std::__cxx11::string::~string((string *)&local_5a8);
            if (bVar3) {
              std::__cxx11::string::operator+=((string *)(path_1.field_2._M_local_buf + 8),'@');
              peVar10 = std::
                        __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_568);
              std::__cxx11::string::operator+=
                        ((string *)(path_1.field_2._M_local_buf + 8),
                         (string *)&peVar10->unit_address);
            }
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
          ::operator++(&__end5);
        }
        std::__cxx11::string::operator+=
                  ((string *)local_1d0,(string *)(node_address.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&local_5c8);
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&next.
                                  super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        if (bVar3) {
          std::__cxx11::string::operator+=((string *)local_1d0,'@');
          std::__cxx11::string::operator+=
                    ((string *)local_1d0,
                     (string *)
                     &next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::shared_ptr<dtc::fdt::node>::operator=
                  ((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8),
                   (shared_ptr<dtc::fdt::node> *)&__range5);
        bVar3 = std::operator==((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8),
                                (nullptr_t)0x0);
        if (bVar3) {
          local_5cc = 0xc;
        }
        else {
          local_5cc = 0;
        }
        std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)&__range5);
        std::__cxx11::string::~string
                  ((string *)
                   &next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__cxx11::string::~string((string *)(node_address.field_2._M_local_buf + 8));
        std::__cxx11::istringstream::~istringstream
                  ((istringstream *)(node_name.field_2._M_local_buf + 8));
      } while (local_5cc == 0);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::istringstream::~istringstream
                ((istringstream *)(path_element.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1d0);
    }
    else {
      pmVar15 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>_>
                ::operator[](&this->node_names,
                             (key_type *)
                             &target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      std::shared_ptr<dtc::fdt::node>::operator=
                ((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8),pmVar15);
    }
    bVar3 = std::operator==((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8),
                            (nullptr_t)0x0);
    pFVar2 = _stderr;
    if (bVar3) {
      if ((this->is_plugin & 1U) == 0) {
        uVar16 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"Failed to find node with label: %s\n",uVar16);
        std::__cxx11::string::string
                  ((string *)
                   &p_1.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&path_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p_1.
                                  super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &p_1.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pFVar2 = _stderr;
        if (bVar3) {
          uVar16 = std::__cxx11::string::c_str();
          fprintf(pFVar2,"Possible intended match: %s\n",uVar16);
        }
        this->valid = false;
        local_5cc = 1;
      }
      else {
        std::
        vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
        ::push_back(&this->unresolved_fixups,this_00);
        local_5cc = 10;
      }
    }
    else {
      std::shared_ptr<dtc::fdt::node>::shared_ptr
                (&local_610,(shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8));
      assign_phandle((device_tree *)local_600,(node_ptr *)this,(uint32_t *)&local_610);
      std::shared_ptr<dtc::fdt::node>::~shared_ptr(&local_610);
      this_01 = std::
                __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_600);
      local_618._M_current = (property_value *)property::begin(this_01);
      this_02 = __gnu_cxx::
                __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                ::operator->(&local_618);
      pfVar13 = std::reference_wrapper<dtc::fdt::device_tree::fixup>::get(this_00);
      property_value::push_to_buffer(this_02,&pfVar13->val->byte_data);
      pfVar13 = std::reference_wrapper<dtc::fdt::device_tree::fixup>::get(this_00);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         (&pfVar13->val->byte_data);
      if (sVar11 != 4) {
        __assert_fail("i.get().val.byte_data.size() == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                      ,0x5e1,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
      }
      std::shared_ptr<dtc::fdt::property>::~shared_ptr((shared_ptr<dtc::fdt::property> *)local_600);
      local_5cc = 0;
    }
    std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
    std::shared_ptr<dtc::fdt::node>::~shared_ptr
              ((shared_ptr<dtc::fdt::node> *)((long)&possible.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((local_5cc != 0) && (local_5cc != 10)) break;
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_*,_std::vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>_>
    ::operator++(&__end2_2);
  }
  std::
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ::~vector((vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
             *)local_110);
  std::
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  ::~unordered_map((unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
                    *)&__range2_1);
  return;
}

Assistant:

void
device_tree::resolve_cross_references(uint32_t &phandle)
{
	for (auto *pv : cross_references)
	{
		node_path path = node_paths[pv->string_data];
		auto p = path.begin();
		auto pe = path.end();
		if (p != pe)
		{
			// Skip the first name in the path.  It's always "", and implicitly /
			for (++p ; p!=pe ; ++p)
			{
				pv->byte_data.push_back('/');
				push_string(pv->byte_data, p->first);
				if (!(p->second.empty()))
				{
					pv->byte_data.push_back('@');
					push_string(pv->byte_data, p->second);
				}
			}
			pv->byte_data.push_back(0);
		}
	}
	std::unordered_map<property_value*, fixup&> phandle_set;
	for (auto &i : fixups)
	{
		phandle_set.insert({&i.val, i});
	}
	std::vector<std::reference_wrapper<fixup>> sorted_phandles;
	root->visit([&](node &n, node *) {
		for (auto &p : n.properties())
		{
			for (auto &v : *p)
			{
				auto i = phandle_set.find(&v);
				if (i != phandle_set.end())
				{
					sorted_phandles.push_back(i->second);
				}
			}
		}
		// Allow recursion
		return node::VISIT_RECURSE;
	}, nullptr);
	assert(sorted_phandles.size() == fixups.size());
	for (auto &i : sorted_phandles)
	{
		string target_name = i.get().val.string_data;
		node_ptr target;
		string possible;
		// If the node name is a path, then look it up by following the path,
		// otherwise jump directly to the named node.
		if (target_name[0] == '/')
		{
			string path;
			target = root;
			std::istringstream ss(target_name);
			string path_element;
			// Read the leading /
			std::getline(ss, path_element, '/');
			// Iterate over path elements
			while (!ss.eof())
			{
				path += '/';
				std::getline(ss, path_element, '/');
				std::istringstream nss(path_element);
				string node_name, node_address;
				std::getline(nss, node_name, '@');
				std::getline(nss, node_address, '@');
				node_ptr next;
				for (auto &c : target->child_nodes())
				{
					if (c->name == node_name)
					{
						if (c->unit_address == node_address)
						{
							next = c;
							break;
						}
						else
						{
							possible = path + c->name;
							if (c->unit_address != string())
							{
								possible += '@';
								possible += c->unit_address;
							}
						}
					}
				}
				path += node_name;
				if (node_address != string())
				{
					path += '@';
					path += node_address;
				}
				target = next;
				if (target == nullptr)
				{
					break;
				}
			}
		}
		else
		{
			target = node_names[target_name];
		}
		if (target == nullptr)
		{
			if (is_plugin)
			{
				unresolved_fixups.push_back(i);
				continue;
			}
			else
			{
				fprintf(stderr, "Failed to find node with label: %s\n", target_name.c_str());
				if (possible != string())
				{
					fprintf(stderr, "Possible intended match: %s\n", possible.c_str());
				}
				valid = 0;
				return;
			}
		}
		// If there is an existing phandle, use it
		property_ptr p = assign_phandle(target, phandle);
		p->begin()->push_to_buffer(i.get().val.byte_data);
		assert(i.get().val.byte_data.size() == 4);
	}
}